

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O2

int __thiscall soplex::SPxDantzigPR<double>::selectLeave(SPxDantzigPR<double> *this)

{
  int iVar1;
  int iVar2;
  SPxSolverBase<double> *pSVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  pSVar3 = (this->super_SPxPricer<double>).thesolver;
  if (pSVar3->sparsePricingLeave != true) {
    dVar10 = -(this->super_SPxPricer<double>).thetolerance;
    uVar7 = (pSVar3->thecovectors->set).thenum;
    dVar11 = dVar10;
    uVar5 = 0xffffffff;
    while (0 < (int)uVar7) {
      uVar7 = uVar7 - 1;
      dVar12 = (pSVar3->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7];
      if (dVar12 < dVar10 && dVar12 < dVar11) {
        dVar11 = dVar12;
        uVar5 = uVar7;
      }
    }
    return uVar5;
  }
  dVar10 = -(this->super_SPxPricer<double>).thetolerance;
  pSVar3 = (this->super_SPxPricer<double>).thesolver;
  uVar8 = (ulong)(uint)(pSVar3->infeasibilities).super_IdxSet.num;
  dVar11 = dVar10;
  iVar1 = -1;
LAB_001ce9fe:
  iVar6 = iVar1;
  dVar12 = dVar11;
  uVar9 = uVar8 & 0xffffffff;
  do {
    uVar8 = uVar8 - 1;
    if ((int)uVar9 < 1) {
      return iVar6;
    }
    piVar4 = (pSVar3->infeasibilities).super_IdxSet.idx;
    iVar1 = piVar4[uVar8];
    dVar11 = (pSVar3->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar1];
    if (dVar10 <= dVar11) {
      iVar2 = (pSVar3->infeasibilities).super_IdxSet.num;
      (pSVar3->infeasibilities).super_IdxSet.num = iVar2 + -1;
      piVar4[uVar8] = piVar4[(long)iVar2 + -1];
      (pSVar3->isInfeasible).data[iVar1] = 0;
    }
    else if (dVar11 < dVar12) goto LAB_001ce9fe;
    uVar9 = (ulong)((int)uVar9 - 1);
  } while( true );
}

Assistant:

int SPxDantzigPR<R>::selectLeave()
{
   assert(this->thesolver != nullptr);

   if(this->thesolver->sparsePricingLeave)
      return selectLeaveSparse();

   //    const R* up  = this->thesolver->ubBound();
   //    const R* low = this->thesolver->lbBound();

   R best = -this->thetolerance;
   int  n    = -1;

   for(int i = this->thesolver->dim() - 1; i >= 0; --i)
   {
      R x = this->thesolver->fTest()[i];

      if(x < -this->thetolerance)
      {
         if(x < best)
         {
            n    = i;
            best = x;
         }
      }
   }

   return n;
}